

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::readPhrases(string *dir_name,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *data)

{
  error_code *peVar1;
  string *p;
  pointer pcVar2;
  undefined8 uVar3;
  directory_iterator dVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  ostream *poVar8;
  bool bVar9;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_2f8;
  ifstream fi;
  dir_itr_imp local_2e8 [16];
  byte abStack_2d8 [488];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_d0;
  undefined1 local_c8 [8];
  string line;
  path targetDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_68;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_60;
  directory_iterator local_58;
  directory_iterator it;
  directory_iterator eod;
  directory_iterator local_40;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *local_38;
  
  line.field_2._8_8_ = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  p = (string *)((long)&line.field_2 + 8);
  local_d0 = data;
  std::__cxx11::string::_M_construct<char*>(p,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_58,(path *)p,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_2f8 = local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
    if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
      UNLOCK();
    }
  }
  local_68 = local_58.m_imp.px;
  local_60.px = (dir_itr_imp *)0x0;
  _fi = 0;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  local_2f8.px = local_68.px;
  if (local_68.px == (dir_itr_imp *)0x0) {
    local_40.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)local_68.px = *(int *)local_68.px + 1;
    UNLOCK();
    local_40.m_imp.px =
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
         (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_68.px;
    if (local_68.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_68.px = *(int *)local_68.px + 1;
      UNLOCK();
    }
  }
  local_38 = &local_60;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  local_2f8.px = local_60.px;
  if (local_60.px == (dir_itr_imp *)0x0) {
    eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  }
  else {
    LOCK();
    *(int *)local_60.px = *(int *)local_60.px + 1;
    UNLOCK();
    eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                   (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_60.px;
    if (local_60.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_60.px = *(int *)local_60.px + 1;
      UNLOCK();
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f8);
  while (dVar4.m_imp.px = local_40.m_imp.px, local_40.m_imp.px != eod.m_imp.px) {
    if ((local_40.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_40.m_imp.px + 0x38) == 0)) {
      if ((eod.m_imp.px == (dir_itr_imp *)0x0) || (*(long *)((long)eod.m_imp.px + 0x38) == 0))
      break;
      if ((local_40.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_40.m_imp.px + 0x38) == 0)) {
        __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                      "/usr/include/boost/filesystem/directory.hpp",0x140,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
    }
    peVar1 = (error_code *)((long)local_40.m_imp.px + 8);
    boost::filesystem::detail::status((path *)&local_2f8,peVar1);
    if ((int)local_2f8.px == 2) {
      boost::filesystem::path::extension();
      iVar6 = boost::filesystem::path::compare((path *)&local_2f8,"swp");
      if (local_2f8.px != local_2e8) {
        operator_delete(local_2f8.px);
      }
      if (iVar6 != 0) {
        std::ifstream::ifstream((istream *)&local_2f8,(string *)peVar1,_S_in);
        if ((abStack_2d8[*(long *)(local_2f8.px + -0x18)] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)((long)dVar4.m_imp.px + 8),
                              *(long *)((long)dVar4.m_imp.px + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::ifstream::~ifstream(&local_2f8);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
          boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                    (&local_40.m_imp);
          bVar9 = false;
          goto LAB_0012311d;
        }
        local_c8 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        targetDir.m_pathname.field_2._8_8_ = 0;
        while( true ) {
          cVar5 = std::ios::widen((char)*(undefined8 *)(local_2f8.px + -0x18) +
                                  (char)(istream *)&local_2f8);
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&local_2f8,(string *)local_c8,cVar5);
          if ((((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) ||
             (line._M_dataplus._M_p == (pointer)0x0)) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&targetDir.m_pathname.field_2 + 8),(value_type *)local_c8);
        }
        boost::filesystem::path::filename();
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_d0,local_f0,(undefined1 *)((long)&targetDir.m_pathname.field_2 + 8));
        uVar3 = targetDir.m_pathname.field_2._8_8_;
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
          uVar3 = targetDir.m_pathname.field_2._8_8_;
        }
        for (; (undefined8 *)uVar3 != (undefined8 *)0x0; uVar3 = (undefined8 *)(uVar3 + 0x20)) {
          if (*(undefined8 **)uVar3 != (undefined8 *)(uVar3 + 0x10)) {
            operator_delete(*(undefined8 **)uVar3);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&targetDir.m_pathname.field_2 + 8));
        if (local_c8 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_c8);
        }
        std::ifstream::~ifstream((istream *)&local_2f8);
      }
    }
    boost::filesystem::detail::directory_iterator_increment(&local_40,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40.m_imp);
  bVar9 = true;
LAB_0012311d:
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(local_38);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_68);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_58.m_imp);
  if ((size_type *)line.field_2._8_8_ != &targetDir.m_pathname._M_string_length) {
    operator_delete((void *)line.field_2._8_8_);
  }
  return bVar9;
}

Assistant:

bool readPhrases(const std::string& dir_name, std::unordered_map<std::string, std::vector<std::string>>& data)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    //line.erase(line.find_last_not_of(" \n\r\t")+1);
                    concr_phrase.push_back(line);
                }
                data.emplace(p.filename().string(), concr_phrase);
                concr_phrase.clear();
            } 
        }
        return true;
    }